

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestInstallerTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupTestInstaller::setup(TEST_GROUP_CppUTestGroupTestInstaller *this)

{
  TestRegistry *this_00;
  TestInstaller *this_01;
  
  this_00 = (TestRegistry *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestInstallerTest.cpp"
                         ,0x2f);
  TestRegistry::TestRegistry(this_00);
  this->myRegistry = this_00;
  (*this_00->_vptr_TestRegistry[0x17])(this_00,this_00);
  this_01 = (TestInstaller *)
            operator_new(8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestInstallerTest.cpp"
                         ,0x31);
  TestInstaller::TestInstaller
            (this_01,&(this->shell).super_UtestShell,"TestInstaller","test",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestInstallerTest.cpp"
             ,0x31);
  this->testInstaller = this_01;
  return;
}

Assistant:

void setup() _override
    {
        myRegistry = new TestRegistry();
        myRegistry->setCurrentRegistry(myRegistry);
        testInstaller = new TestInstaller(shell, "TestInstaller", "test", __FILE__, __LINE__);
    }